

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxalloc.h
# Opt level: O0

void soplex::
     spx_alloc<soplex::SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,(boost::multiprecision::expression_template_option)1>>*>
               (SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                **p,int n)

{
  void *pvVar1;
  ostream *poVar2;
  string *m;
  uint in_ESI;
  long *in_RDI;
  allocator *this;
  allocator local_31;
  string local_30 [36];
  uint local_c;
  long *local_8;
  
  local_c = in_ESI;
  if (in_ESI == 0) {
    local_c = 1;
  }
  local_8 = in_RDI;
  pvVar1 = malloc((ulong)local_c * 0x210);
  *local_8 = (long)pvVar1;
  if (*local_8 == 0) {
    poVar2 = std::operator<<((ostream *)&std::cerr,
                             "EMALLC01 malloc: Out of memory - cannot allocate ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,(ulong)local_c * 0x210);
    poVar2 = std::operator<<(poVar2," bytes");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    m = (string *)__cxa_allocate_exception(0x28);
    this = &local_31;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_30,"XMALLC01 malloc: Could not allocate enough memory",this);
    SPxMemoryException::SPxMemoryException((SPxMemoryException *)this,m);
    __cxa_throw(m,&SPxMemoryException::typeinfo,SPxMemoryException::~SPxMemoryException);
  }
  return;
}

Assistant:

inline void spx_alloc(T& p, int n = 1)
{
   assert(p == nullptr);
   assert(n >= 0);

   if(n == 0)
      n = 1;

   try
   {
      p = reinterpret_cast<T>(malloc(sizeof(*p) * (unsigned int) n));
   }
   catch(const std::bad_alloc&)
   {
      throw(SPxMemoryException("Error allocating memory"));
   }

   if(nullptr == p)
   {
      // coverity[suspicious_sizeof]
      std::cerr << "EMALLC01 malloc: Out of memory - cannot allocate "
                << sizeof(*p) * (unsigned int) n << " bytes" << std::endl;
      throw(SPxMemoryException("XMALLC01 malloc: Could not allocate enough memory"));
   }
}